

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantum.cpp
# Opt level: O3

void __thiscall quantum::QuantumComputer::extendRegister(QuantumComputer *this,int resizeAmount)

{
  iterator __position;
  double dVar1;
  double dVar2;
  long *plVar3;
  int iVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double local_50;
  undefined1 local_48 [16];
  
  if (this->registerSize < resizeAmount) {
    dVar1 = ldexp(1.0,this->registerSize);
    local_48._8_4_ = SUB84((double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc),0);
    local_48._0_8_ = (double)(int)dVar1;
    local_48._12_4_ =
         (int)((ulong)(double)(int)(double)CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) >> 0x20);
    dVar2 = ldexp(1.0,resizeAmount);
    if ((double)local_48._0_8_ < dVar2) {
      iVar4 = (int)dVar1;
      do {
        iVar4 = iVar4 + 1;
        local_50 = 0.0;
        __position._M_current =
             (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&this->baseVector,__position,&local_50);
        }
        else {
          *__position._M_current = 0.0;
          (this->baseVector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_48._0_8_ = (double)iVar4;
        dVar1 = ldexp(1.0,resizeAmount);
      } while ((double)local_48._0_8_ < dVar1);
    }
    this->registerSize = resizeAmount;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Register resized correctly",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    std::ostream::put(-0x68);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of qubits in register: ",0x1e);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,resizeAmount);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"You can only resize your register, not decrease",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void quantum::QuantumComputer::extendRegister(int resizeAmount) {
    if (this->registerSize >= resizeAmount) {
        std::cout << "You can only resize your register, not decrease" << std::endl;
        return;
    }

    int sizeOfBaseVector = (int) this->baseVector.size();

    int elementsToAdd = resizeAmount - this->registerSize;
    if (elementsToAdd < 0) {
        std::cout << "Number of Qubits to add must be positive" << std::endl;
        return;
    }

    for (int i = pow(2, this->registerSize); i < pow(2, resizeAmount); i++) {
        this->baseVector.push_back(0);
    }

    this->registerSize = resizeAmount;

    std::cout << "Register resized correctly" << std::endl;
    std::cout << "Number of qubits in register: " << resizeAmount << std::endl;

}